

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_stop_doc(Parser *this)

{
  size_t i;
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  NodeData *pNVar6;
  csubstr cVar7;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_58;
  size_t local_50;
  char msg [41];
  
  i = this->m_state->node_id;
  pNVar6 = Tree::_p(this->m_tree,i);
  if (((pNVar6->m_type).type & DOC) == NOTYPE) {
    builtin_strncpy(msg,"check failed: (m_tree->is_doc(doc_node))",0x29);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar7.len;
    pcStack_58 = cVar7.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7783) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7783) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar6 = Tree::_p(this->m_tree,i);
  if (((pNVar6->m_type).type & SEQ) == NOTYPE) {
    pNVar6 = Tree::_p(this->m_tree,i);
    if (((pNVar6->m_type).type & MAP) == NOTYPE) {
      pNVar6 = Tree::_p(this->m_tree,i);
      if (((pNVar6->m_type).type & KEYVAL) != VAL) {
        if ((this->m_state->flags & 0x200) != 0) {
          builtin_strncpy(msg,"check failed: (has_none(SSCL))",0x1f);
          if (((byte)s_error_flags & 1) != 0) {
            bVar5 = is_debugger_attached();
            if (bVar5) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar7 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
          local_78 = cVar7.len;
          pcStack_80 = cVar7.str;
          LVar4.super_LineCol.col = 0;
          LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7786) << 0x40,0);
          LVar4.super_LineCol.line = SUB168(ZEXT816(0x7786) << 0x40,8);
          LVar4.name.str = pcStack_80;
          LVar4.name.len = local_78;
          (*p_Var1)(msg,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
        }
        Tree::to_val(this->m_tree,i,(csubstr)ZEXT816(0),0x10);
      }
    }
  }
  return;
}

Assistant:

void Parser::_stop_doc()
{
    size_t doc_node = m_state->node_id;
    _c4dbgpf("stop_doc[{}]", doc_node);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_doc(doc_node));
    if(!m_tree->is_seq(doc_node) && !m_tree->is_map(doc_node) && !m_tree->is_val(doc_node))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
        _c4dbgpf("stop_doc[{}]: there was nothing; adding null val", doc_node);
        m_tree->to_val(doc_node, {}, DOC);
    }
}